

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  Token *pTVar1;
  pointer pbVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  Result RVar6;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var7;
  _Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_> _Var8;
  undefined8 uVar9;
  __off64_t *in_R8;
  size_t in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  uint in_stack_fffffffffffffc38;
  Token local_378;
  Token local_328;
  Token local_2d8;
  Token local_288;
  Token local_238;
  Token local_1e8;
  Token local_198;
  Token local_148;
  _Head_base<0UL,_wabt::Expr_*,_false> local_f8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e0;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_d8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_d0;
  undefined1 local_c8 [8];
  Location loc;
  ExprList cond;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  allocator_type local_32;
  allocator_type local_31;
  _Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_> local_30;
  
  bVar3 = PeekMatch(this,Lpar);
  RVar6.enum_ = Error;
  if (!bVar3) {
    return (Result)Error;
  }
  TVar4 = Peek(this,1);
  if ((TVar4 - AtomicLoad < 0x34) &&
     ((0xdfffffd33df7fU >> ((ulong)(TVar4 - AtomicLoad) & 0x3f) & 1) != 0)) {
    Consume((Token *)&stack0xfffffffffffffc38,this);
    Token::~Token((Token *)&stack0xfffffffffffffc38);
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    RVar5 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_50);
    if ((RVar5.enum_ != Error) && (RVar5 = ParseExprList(this,exprs), RVar5.enum_ != Error)) {
      std::__cxx11::string::string
                ((string *)(loc.field_1.field2 + 8),"an expr",(allocator *)&local_30);
      __l._M_len = 1;
      __l._M_array = (iterator)((long)&loc.field_1 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8,__l,&local_31);
      RVar5 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_c8,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8);
      std::__cxx11::string::~string((string *)(loc.field_1.field2 + 8));
      if (RVar5.enum_ != Error) {
        local_f8._M_head_impl =
             (Expr *)local_50.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f8);
        if ((IfExceptExpr *)local_f8._M_head_impl != (IfExceptExpr *)0x0) {
          (*(((ExprMixin<(wabt::ExprType)20> *)&(local_f8._M_head_impl)->_vptr_Expr)->super_Expr).
            _vptr_Expr[1])();
        }
        local_f8._M_head_impl = (Expr *)0x0;
        bVar3 = true;
        _Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
             (_Head_base<0UL,_wabt::Expr_*,_false>)
             (_Head_base<0UL,_wabt::Expr_*,_false>)
             local_50.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00da4964;
      }
    }
    bVar3 = false;
    _Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (_Head_base<0UL,_wabt::Expr_*,_false>)
         (_Head_base<0UL,_wabt::Expr_*,_false>)
         local_50.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    GetLocation((Location *)local_c8,this);
    TVar4 = Peek(this,1);
    if (TVar4 == Try) {
      Consume(&local_148,this);
      Token::~Token(&local_148);
      pTVar1 = (Token *)((long)&loc.field_1 + 8);
      Consume(pTVar1,this);
      ErrorUnlessOpcodeEnabled(this,pTVar1);
      Token::~Token((Token *)((long)&loc.field_1 + 8));
      MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_50,(Location *)local_c8);
      RVar6 = ParseLabelOpt(this,(string *)
                                 ((long)local_50.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 0x40));
      if (((RVar6.enum_ == Error) ||
          (RVar6 = ParseBlockDeclaration
                             (this,&((Block *)
                                    ((long)local_50.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 0x40))->decl)
          , RVar6.enum_ == Error)) ||
         (RVar6 = ParseInstrList(this,&((Block *)
                                       ((long)local_50.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 0x40))->
                                       exprs), RVar6.enum_ == Error)) {
LAB_00da4d5b:
        bVar3 = false;
        uVar9 = local_50.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        GetLocation((Location *)((long)&loc.field_1 + 8),this);
        (((Block *)
         ((long)local_50.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x40))->end_loc).field_1.field_1.offset
             = (size_t)cond.last_;
        *(size_t *)
         ((long)&(((Block *)
                  ((long)local_50.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x40))->end_loc).field_1 + 8) =
             cond.size_;
        (((Block *)
         ((long)local_50.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x40))->end_loc).filename.data_ =
             (char *)loc.field_1._8_8_;
        (((Block *)
         ((long)local_50.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x40))->end_loc).filename.size_ =
             (size_type)cond.first_;
        RVar6 = Expect(this,Lpar);
        if (((RVar6.enum_ == Error) || (RVar6 = Expect(this,Catch), RVar6.enum_ == Error)) ||
           ((RVar6 = ParseTerminatingInstrList
                               (this,(ExprList *)
                                     ((long)local_50.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0x118)),
            RVar6.enum_ == Error ||
            (RVar6 = Expect(this,Rpar),
            pbVar2 = local_50.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, RVar6.enum_ == Error))))
        goto LAB_00da4d5b;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d0._M_head_impl = (Expr *)pbVar2;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_d0);
        if ((IfExceptExpr *)local_d0._M_head_impl != (IfExceptExpr *)0x0) {
          (*(((ExprMixin<(wabt::ExprType)20> *)&(local_d0._M_head_impl)->_vptr_Expr)->super_Expr).
            _vptr_Expr[1])();
        }
        local_d0._M_head_impl = (Expr *)0x0;
        bVar3 = true;
        uVar9 = local_50.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      }
LAB_00da4ee6:
      if ((IfExceptExpr *)uVar9 != (IfExceptExpr *)0x0) {
        (*(((IfExceptExpr *)uVar9)->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])()
        ;
      }
      if (!bVar3) {
        return (Result)Error;
      }
      goto LAB_00da4974;
    }
    if (TVar4 == IfExcept) {
      Consume(&local_198,this);
      Token::~Token(&local_198);
      pTVar1 = (Token *)((long)&loc.field_1 + 8);
      Consume(pTVar1,this);
      ErrorUnlessOpcodeEnabled(this,pTVar1);
      Token::~Token((Token *)((long)&loc.field_1 + 8));
      MakeUnique<wabt::IfExceptExpr,wabt::Location&>((wabt *)&local_30,(Location *)local_c8);
      RVar5 = ParseIfExceptHeader(this,(IfExceptExpr *)
                                       local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                       _M_head_impl);
      RVar6.enum_ = Error;
      if (RVar5.enum_ != Error) {
        bVar3 = PeekMatchExpr(this);
        if (bVar3) {
          loc.field_1._8_8_ = 0;
          cond.first_ = (Expr *)0x0;
          cond.last_ = (Expr *)0x0;
          RVar5 = ParseExpr(this,(ExprList *)((long)&loc.field_1 + 8));
          if (RVar5.enum_ == Error) {
LAB_00da4e16:
            RVar6.enum_ = Error;
            intrusive_list<wabt::Expr>::clear
                      ((intrusive_list<wabt::Expr> *)((long)&loc.field_1 + 8));
            goto LAB_00da51ad;
          }
          intrusive_list<wabt::Expr>::splice
                    (exprs,(int)exprs,(__off64_t *)0x0,(int)&loc.field_1 + 8,in_R8,in_R9,
                     in_stack_fffffffffffffc38);
          intrusive_list<wabt::Expr>::clear((intrusive_list<wabt::Expr> *)((long)&loc.field_1 + 8));
        }
        bVar3 = MatchLpar(this,Then);
        if (bVar3) {
          RVar5 = ParseTerminatingInstrList
                            (this,&((Block *)
                                   ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                          _M_head_impl + 0x40))->exprs);
          if (RVar5.enum_ != Error) {
            GetLocation((Location *)((long)&loc.field_1 + 8),this);
            (((Block *)
             ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
            end_loc).field_1.field_1.offset = (size_t)cond.last_;
            *(size_t *)
             ((long)&(((Block *)
                      ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40
                      ))->end_loc).field_1 + 8) = cond.size_;
            (((Block *)
             ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
            end_loc).filename.data_ = (char *)loc.field_1._8_8_;
            (((Block *)
             ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
            end_loc).filename.size_ = (size_type)cond.first_;
            RVar5 = Expect(this,Rpar);
            if (RVar5.enum_ != Error) {
              bVar3 = MatchLpar(this,Else);
              if (!bVar3) {
                bVar3 = PeekMatchExpr(this);
                if (bVar3) {
                  RVar5 = ParseExpr(this,(ExprList *)
                                         ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                                _M_head_impl + 0x118));
                  goto LAB_00da51d6;
                }
LAB_00da51db:
                GetLocation((Location *)((long)&loc.field_1 + 8),this);
LAB_00da51ea:
                (((anon_union_16_2_ecfd7102_for_Location_1 *)
                 ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x140))->
                field_1).offset = (size_t)cond.last_;
                *(size_t *)
                 ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x148) =
                     cond.size_;
                (((Location *)
                 ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x130))->
                filename).data_ = (char *)loc.field_1._8_8_;
                *(Expr **)((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl +
                          0x138) = cond.first_;
                _Var7 = local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
LAB_00da520a:
                local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                     (_Head_base<0UL,_wabt::Expr_*,_false>)(Expr *)0x0;
                local_d8._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                     (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
                     (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)_Var7._M_head_impl;
                intrusive_list<wabt::Expr>::push_back
                          (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_d8);
                if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
                    local_d8._M_t.
                    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
                  (**(code **)(*(long *)local_d8._M_t.
                                        super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                                        .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8
                              ))();
                }
                local_d8._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                     (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
                     (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)0x0;
LAB_00da52c8:
                RVar6.enum_ = Error;
                bVar3 = true;
                _Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                     (_Head_base<0UL,_wabt::Expr_*,_false>)
                     (_Head_base<0UL,_wabt::Expr_*,_false>)local_30;
                goto LAB_00da4964;
              }
              RVar5 = ParseTerminatingInstrList
                                (this,(ExprList *)
                                      ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                             _M_head_impl + 0x118));
              if (RVar5.enum_ != Error) {
                RVar5 = Expect(this,Rpar);
LAB_00da51d6:
                if (RVar5.enum_ != Error) goto LAB_00da51db;
              }
            }
          }
        }
        else {
          bVar3 = PeekMatchExpr(this);
          if (bVar3) {
            RVar5 = ParseExpr(this,&((Block *)
                                    ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                           _M_head_impl + 0x40))->exprs);
            if (RVar5.enum_ != Error) {
              GetLocation((Location *)((long)&loc.field_1 + 8),this);
              (((Block *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
              end_loc).field_1.field_1.offset = (size_t)cond.last_;
              *(size_t *)
               ((long)&(((Block *)
                        ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl +
                        0x40))->end_loc).field_1 + 8) = cond.size_;
              (((Block *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
              end_loc).filename.data_ = (char *)loc.field_1._8_8_;
              (((Block *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
              end_loc).filename.size_ = (size_type)cond.first_;
              bVar3 = PeekMatchExpr(this);
              _Var7 = local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
              if (!bVar3) goto LAB_00da520a;
              RVar5 = ParseExpr(this,(ExprList *)
                                     ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                            _M_head_impl + 0x118));
              if (RVar5.enum_ != Error) {
                GetLocation((Location *)((long)&loc.field_1 + 8),this);
                goto LAB_00da51ea;
              }
            }
          }
          else {
            ConsumeIfLpar(this);
            std::__cxx11::string::string
                      ((string *)(loc.field_1.field2 + 8),"then block",(allocator *)&local_31);
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)((long)&loc.field_1 + 8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_50,__l_00,&local_32);
            RVar6 = ErrorExpected(this,&local_50,"(then ...)");
LAB_00da5195:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_50);
            std::__cxx11::string::~string((string *)(loc.field_1.field2 + 8));
          }
        }
      }
    }
    else {
      if (TVar4 != If) {
        if (TVar4 == Loop) {
          Consume(&local_2d8,this);
          Token::~Token(&local_2d8);
          Consume(&local_288,this);
          Token::~Token(&local_288);
          MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Location&>
                    ((wabt *)(loc.field_1.field2 + 8),(Location *)local_c8);
          RVar6 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
          if ((RVar6.enum_ == Error) ||
             (RVar6 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)),
             uVar9 = loc.field_1._8_8_, RVar6.enum_ == Error)) goto LAB_00da4e9d;
          loc.field_1._8_8_ = 0;
          local_e8._M_head_impl = (Expr *)uVar9;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
          if (local_e8._M_head_impl != (Expr *)0x0) {
            (*(local_e8._M_head_impl)->_vptr_Expr[1])();
          }
          local_e8._M_head_impl = (Expr *)0x0;
        }
        else {
          if (TVar4 != Block) {
            __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                          ,0x830,"Result wabt::WastParser::ParseExpr(ExprList *)");
          }
          Consume(&local_378,this);
          Token::~Token(&local_378);
          Consume(&local_328,this);
          Token::~Token(&local_328);
          MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>
                    ((wabt *)(loc.field_1.field2 + 8),(Location *)local_c8);
          RVar6 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
          if ((RVar6.enum_ == Error) ||
             (RVar6 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)),
             uVar9 = loc.field_1._8_8_, RVar6.enum_ == Error)) {
LAB_00da4e9d:
            bVar3 = false;
            uVar9 = loc.field_1._8_8_;
            goto LAB_00da4ee6;
          }
          loc.field_1._8_8_ = 0;
          local_f0._M_head_impl = (Expr *)uVar9;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
          if (local_f0._M_head_impl != (Expr *)0x0) {
            (*(local_f0._M_head_impl)->_vptr_Expr[1])();
          }
          local_f0._M_head_impl = (Expr *)0x0;
        }
        bVar3 = true;
        uVar9 = loc.field_1._8_8_;
        goto LAB_00da4ee6;
      }
      Consume(&local_238,this);
      Token::~Token(&local_238);
      Consume(&local_1e8,this);
      Token::~Token(&local_1e8);
      MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_30,(Location *)local_c8);
      RVar5 = ParseLabelOpt(this,(string *)
                                 ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                        _M_head_impl + 0x40));
      RVar6.enum_ = Error;
      if ((RVar5.enum_ != Error) &&
         (RVar5 = ParseBlockDeclaration
                            (this,&((Block *)
                                   ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                          _M_head_impl + 0x40))->decl), RVar5.enum_ != Error)) {
        bVar3 = PeekMatchExpr(this);
        if (bVar3) {
          loc.field_1._8_8_ = 0;
          cond.first_ = (Expr *)0x0;
          cond.last_ = (Expr *)0x0;
          RVar5 = ParseExpr(this,(ExprList *)((long)&loc.field_1 + 8));
          if (RVar5.enum_ == Error) goto LAB_00da4e16;
          intrusive_list<wabt::Expr>::splice
                    (exprs,(int)exprs,(__off64_t *)0x0,(int)&loc.field_1 + 8,in_R8,in_R9,
                     in_stack_fffffffffffffc38);
          intrusive_list<wabt::Expr>::clear((intrusive_list<wabt::Expr> *)((long)&loc.field_1 + 8));
        }
        bVar3 = MatchLpar(this,Then);
        if (!bVar3) {
          bVar3 = PeekMatchExpr(this);
          if (bVar3) {
            RVar5 = ParseExpr(this,&((Block *)
                                    ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                           _M_head_impl + 0x40))->exprs);
            if (RVar5.enum_ != Error) {
              GetLocation((Location *)((long)&loc.field_1 + 8),this);
              (((Block *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
              end_loc).field_1.field_1.offset = (size_t)cond.last_;
              *(size_t *)
               ((long)&(((Block *)
                        ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl +
                        0x40))->end_loc).field_1 + 8) = cond.size_;
              (((Block *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
              end_loc).filename.data_ = (char *)loc.field_1._8_8_;
              (((Block *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))->
              end_loc).filename.size_ = (size_type)cond.first_;
              bVar3 = PeekMatchExpr(this);
              _Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                   (_Head_base<0UL,_wabt::Expr_*,_false>)
                   (_Head_base<0UL,_wabt::Expr_*,_false>)local_30;
              if (!bVar3) goto LAB_00da5296;
              RVar5 = ParseExpr(this,(ExprList *)
                                     ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                            _M_head_impl + 0x118));
              if (RVar5.enum_ != Error) {
                GetLocation((Location *)((long)&loc.field_1 + 8),this);
                goto LAB_00da5276;
              }
            }
            goto LAB_00da51ad;
          }
          ConsumeIfLpar(this);
          std::__cxx11::string::string
                    ((string *)(loc.field_1.field2 + 8),"then block",(allocator *)&local_31);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)((long)&loc.field_1 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_50,__l_01,&local_32);
          RVar6 = ErrorExpected(this,&local_50,"(then ...)");
          goto LAB_00da5195;
        }
        RVar5 = ParseTerminatingInstrList
                          (this,&((Block *)
                                 ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                        _M_head_impl + 0x40))->exprs);
        if (RVar5.enum_ != Error) {
          GetLocation((Location *)((long)&loc.field_1 + 8),this);
          (((Block *)((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40)
           )->end_loc).field_1.field_1.offset = (size_t)cond.last_;
          *(size_t *)
           ((long)&(((Block *)
                    ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40))
                   ->end_loc).field_1 + 8) = cond.size_;
          (((Block *)((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40)
           )->end_loc).filename.data_ = (char *)loc.field_1._8_8_;
          (((Block *)((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40)
           )->end_loc).filename.size_ = (size_type)cond.first_;
          RVar5 = Expect(this,Rpar);
          if (RVar5.enum_ != Error) {
            bVar3 = MatchLpar(this,Else);
            if (!bVar3) {
              bVar3 = PeekMatchExpr(this);
              if (bVar3) {
                RVar5 = ParseExpr(this,(ExprList *)
                                       ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                              _M_head_impl + 0x118));
                goto LAB_00da525e;
              }
LAB_00da5267:
              GetLocation((Location *)((long)&loc.field_1 + 8),this);
LAB_00da5276:
              (((Location *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x130))->
              field_1).field_1.offset = (size_t)cond.last_;
              *(size_t *)
               ((long)&((Location *)
                       ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl +
                       0x130))->field_1 + 8) = cond.size_;
              (((Location *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x130))->
              filename).data_ = (char *)loc.field_1._8_8_;
              (((Location *)
               ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x130))->
              filename).size_ = (size_type)cond.first_;
              _Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                   local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
LAB_00da5296:
              local_30.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                   (_Head_base<0UL,_wabt::Expr_*,_false>)(Expr *)0x0;
              local_e0 = _Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
              intrusive_list<wabt::Expr>::push_back
                        (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e0
                        );
              if ((IfExceptExpr *)local_e0._M_head_impl != (IfExceptExpr *)0x0) {
                (*(((ExprMixin<(wabt::ExprType)20> *)&(local_e0._M_head_impl)->_vptr_Expr)->
                  super_Expr)._vptr_Expr[1])();
              }
              local_e0._M_head_impl = (Expr *)0x0;
              goto LAB_00da52c8;
            }
            RVar5 = ParseTerminatingInstrList
                              (this,(ExprList *)
                                    ((long)local_30.super__Head_base<0UL,_wabt::Expr_*,_false>.
                                           _M_head_impl + 0x118));
            if (RVar5.enum_ != Error) {
              RVar5 = Expect(this,Rpar);
LAB_00da525e:
              if (RVar5.enum_ != Error) goto LAB_00da5267;
            }
          }
        }
      }
    }
LAB_00da51ad:
    bVar3 = false;
    _Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (_Head_base<0UL,_wabt::Expr_*,_false>)(_Head_base<0UL,_wabt::Expr_*,_false>)local_30;
  }
LAB_00da4964:
  if (_Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (*(((IfExceptExpr *)_Var8.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl)->
      super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
  }
  if (!bVar3) {
    return (Result)RVar6.enum_;
  }
LAB_00da4974:
  RVar6 = Expect(this,Rpar);
  return (Result)(uint)(RVar6.enum_ == Error);
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = MakeUnique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = MakeUnique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = MakeUnique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::IfExcept: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());
        auto expr = MakeUnique<IfExceptExpr>(loc);

        CHECK_RESULT(ParseIfExceptHeader(expr.get()));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = MakeUnique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        EXPECT(Lpar);
        EXPECT(Catch);
        CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
        EXPECT(Rpar);
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}